

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O2

void canvas_savetofile(_glist *x,t_symbol *filename,t_symbol *dir,float fdestroy)

{
  uint uVar1;
  t_dataslot *ptVar2;
  undefined8 uVar3;
  char *pcVar4;
  t_symbol **fatso;
  int iVar5;
  _binbuf *b;
  long lVar6;
  t_template *ptVar7;
  t_symbol *ptVar8;
  t_symbol *ptVar9;
  int *piVar10;
  char *pcVar11;
  int in_ECX;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  char *pcVar15;
  int ntemplates;
  t_symbol **templatevec;
  uint local_3c;
  t_symbol **local_38;
  
  b = binbuf_new();
  local_38 = (t_symbol **)getbytes(0);
  local_3c = 0;
  canvas_collecttemplatesfor(x,(int *)&local_3c,&local_38,in_ECX);
  fatso = local_38;
  lVar6 = (long)(int)local_3c;
  uVar12 = 0;
  if (0 < (int)local_3c) {
    uVar12 = (ulong)local_3c;
  }
  uVar14 = 0;
  do {
    if (uVar14 == uVar12) {
      freebytes(fatso,lVar6 << 3);
      canvas_saveto(x,b);
      piVar10 = __errno_location();
      *piVar10 = 0;
      iVar5 = binbuf_write(b,filename->s_name,dir->s_name,0);
      if (iVar5 == 0) {
        if (x->gl_owner == (_glist *)0x0) {
          canvas_rename(x,filename,dir);
          canvas_updatewindowlist();
        }
        post("saved to: %s/%s",dir->s_name,filename->s_name);
        canvas_dirty(x,0.0);
        canvas_reload(filename,dir,x);
        if ((fdestroy != 0.0) || (NAN(fdestroy))) {
          ptVar8 = gensym("menuclose");
          pd_vmess((t_pd *)x,ptVar8,"f",0x3ff0000000000000);
        }
      }
      else {
        pcVar15 = dir->s_name;
        pcVar4 = filename->s_name;
        if (*piVar10 == 0) {
          pcVar11 = "write failed";
        }
        else {
          pcVar11 = strerror(*piVar10);
        }
        post("%s/%s: %s",pcVar15,pcVar4,pcVar11);
      }
      binbuf_free(b);
      return;
    }
    ptVar7 = template_findbyname(fatso[uVar14]);
    if (ptVar7 == (t_template *)0x0) {
      bug("canvas_savetemplatesto");
    }
    else {
      uVar1 = ptVar7->t_n;
      ptVar8 = gensym("struct");
      ptVar9 = gensym(fatso[uVar14]->s_name + 3);
      binbuf_addv(b,"sss",&s__N,ptVar8,ptVar9);
      if ((int)uVar1 < 1) {
        uVar1 = 0;
      }
      for (lVar13 = 0; (ulong)uVar1 * 0x18 - lVar13 != 0; lVar13 = lVar13 + 0x18) {
        ptVar8 = &s_float;
        switch(*(undefined4 *)((long)&ptVar7->t_vec->ds_type + lVar13)) {
        case 0:
          break;
        case 1:
          ptVar8 = &s_symbol;
          break;
        case 2:
          pcVar15 = "text";
          goto LAB_0014d1ec;
        case 3:
          pcVar15 = "array";
LAB_0014d1ec:
          ptVar8 = gensym(pcVar15);
          break;
        default:
          bug("canvas_write");
          ptVar8 = &s_float;
        }
        ptVar2 = ptVar7->t_vec;
        uVar3 = *(undefined8 *)((long)&ptVar2->ds_name + lVar13);
        if (*(int *)((long)&ptVar2->ds_type + lVar13) == 3) {
          ptVar9 = gensym((char *)(**(long **)((long)&ptVar2->ds_arraytemplate + lVar13) + 3));
          binbuf_addv(b,"sss",ptVar8,uVar3,ptVar9);
        }
        else {
          binbuf_addv(b,"ss",ptVar8);
        }
      }
      binbuf_addsemi(b);
    }
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

static void canvas_savetofile(t_canvas *x, t_symbol *filename, t_symbol *dir,
    float fdestroy)
{
    t_binbuf *b = binbuf_new();
    canvas_savetemplatesto(x, b, 1);
    canvas_saveto(x, b);
    errno = 0;
    if (binbuf_write(b, filename->s_name, dir->s_name, 0))
        post("%s/%s: %s", dir->s_name, filename->s_name,
            (errno ? strerror(errno) : "write failed"));
    else
    {
            /* if not an abstraction, reset title bar and directory */
        if (!x->gl_owner)
{
            canvas_rename(x, filename, dir);
            /* update window list in case Save As changed the window name */
            canvas_updatewindowlist();
}
        post("saved to: %s/%s", dir->s_name, filename->s_name);
        canvas_dirty(x, 0);
        canvas_reload(filename, dir, x);
        if (fdestroy != 0)
            vmess(&x->gl_pd, gensym("menuclose"), "f", 1.);
    }
    binbuf_free(b);
}